

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complextype.cpp
# Opt level: O2

ResultValue * __thiscall
ComplexType::toResultValue
          (ResultValue *__return_storage_ptr__,ComplexType *this,NumericConstant *numericConstant)

{
  NumericConstantChar numChar;
  bool bVar1;
  NumericChars *pNVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  size_t i;
  ulong uVar4;
  ResultValue *this_00;
  char *pcVar5;
  bool bVar6;
  Complex value;
  string imaginaryPart;
  string realPart;
  allocator local_81;
  double local_80;
  ResultValue *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"",&local_81);
  bVar6 = true;
  bVar1 = false;
  uVar4 = 0;
  do {
    pNVar2 = NumericConstant::chars(numericConstant);
    if ((ulong)((long)(pNVar2->
                      super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pNVar2->
                     super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= uVar4) {
      if (bVar1) {
        bVar1 = std::operator!=(&local_50,"");
        this_00 = local_78;
        if (bVar1) {
          local_80 = std::__cxx11::stod(&local_50,(size_t *)0x0);
          pcVar5 = (char *)0x0;
          std::__cxx11::stod(&local_70,(size_t *)0x0);
          uVar3 = extraout_RDX;
        }
        else {
          pcVar5 = "";
          bVar1 = std::operator!=(&local_70,"");
          local_80 = 0.0;
          uVar3 = extraout_RDX_01;
          if (bVar1) {
            pcVar5 = (char *)0x0;
            std::__cxx11::stod(&local_70,(size_t *)0x0);
            uVar3 = extraout_RDX_02;
          }
        }
      }
      else {
        pcVar5 = (char *)0x0;
        local_80 = std::__cxx11::stod(&local_50,(size_t *)0x0);
        uVar3 = extraout_RDX_00;
        this_00 = local_78;
      }
      value._M_value._8_8_ = uVar3;
      value._M_value._0_8_ = pcVar5;
      ResultValue::ResultValue(this_00,value);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      return this_00;
    }
    pNVar2 = NumericConstant::chars(numericConstant);
    numChar = (pNVar2->super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar4];
    if (numChar < 0x14) {
      if ((0x403ffU >> (numChar & 0x1f) & 1) == 0) {
        if ((0x30000U >> (numChar & 0x1f) & 1) == 0) {
          if (numChar == 0x13) {
            if (!bVar6) {
              bVar1 = true;
              goto LAB_0013caac;
            }
            std::__cxx11::string::_M_assign((string *)&local_70);
            bVar6 = true;
            std::__cxx11::string::assign((char *)&local_50);
            bVar1 = true;
          }
        }
        else {
          if (uVar4 == 0) goto LAB_0013ca44;
          std::__cxx11::string::_M_assign((string *)&local_50);
LAB_0013caac:
          bVar6 = false;
        }
      }
      else {
LAB_0013ca44:
        NumericConstantChars::getChar(numChar);
        std::__cxx11::string::push_back((char)&local_50);
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

ResultValue ComplexType::toResultValue(const NumericConstant& numericConstant) const {
	std::string realPart = "";
	std::string imaginaryPart = "";
	std::string& currentPart = realPart;
	bool atRealPart = true;
	bool isComplex = false;

	for (std::size_t i = 0; i < numericConstant.chars().size(); i++) {
		auto c = numericConstant.chars()[i];

		switch (c) {
			case NumericConstantChar::Zero:
			case NumericConstantChar::One:
			case NumericConstantChar::Two:
			case NumericConstantChar::Three:
			case NumericConstantChar::Four:
			case NumericConstantChar::Five:
			case NumericConstantChar::Six:
			case NumericConstantChar::Seven:
			case NumericConstantChar::Eight:
			case NumericConstantChar::Nine:
			case NumericConstantChar::DecimalPoint:
				currentPart += NumericConstantChars::getChar(c);
				break;
			case NumericConstantChar::MinusSign:
			case NumericConstantChar::PlusSign:
				if (i > 0) {
					currentPart = imaginaryPart;
					atRealPart = false;
				} else {
					currentPart += NumericConstantChars::getChar(c);
				}
				break;
			case NumericConstantChar::ImaginaryUnit:
				if (atRealPart) {
					imaginaryPart = realPart;
					realPart = "";
				}

				isComplex = true;
				break;
			default:
				break;
		}
	}

	if (isComplex) {
		if (realPart != "") {
			return Complex(std::stod(realPart), std::stod(imaginaryPart));
		} else if (imaginaryPart != "") {
			return Complex(0.0, std::stod(imaginaryPart));
		} else {
			return Complex(0.0, 1.0);
		}
	} else {
		return Complex(std::stod(realPart), 0.0);
	}
}